

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScopeInfo.cpp
# Opt level: O0

ScopeInfo *
Js::ScopeInfo::SaveScopeInfo
          (ByteCodeGenerator *byteCodeGenerator,Scope *scope,ScriptContext *scriptContext)

{
  bool bVar1;
  ScopeType SVar2;
  FuncInfo *this;
  ScriptContext *pSVar3;
  Scope *scope_00;
  ScopeInfo *parent;
  ScopeInfo *scopeInfo;
  FuncInfo *func;
  ScriptContext *scriptContext_local;
  Scope *scope_local;
  ByteCodeGenerator *byteCodeGenerator_local;
  
  for (scriptContext_local = (ScriptContext *)scope; scriptContext_local != (ScriptContext *)0x0;
      scriptContext_local = (ScriptContext *)Scope::GetEnclosingScope((Scope *)scriptContext_local))
  {
    this = Scope::GetFunc((Scope *)scriptContext_local);
    bVar1 = Scope::GetMustInstantiate((Scope *)scriptContext_local);
    if (((bVar1) ||
        (pSVar3 = (ScriptContext *)FuncInfo::GetBodyScope(this), pSVar3 == scriptContext_local)) ||
       ((pSVar3 = (ScriptContext *)FuncInfo::GetParamScope(this), pSVar3 == scriptContext_local &&
        ((bVar1 = FuncInfo::IsBodyAndParamScopeMerged(this), bVar1 &&
         (bVar1 = Scope::GetHasNestedParamFunc((Scope *)scriptContext_local), bVar1)))))) break;
  }
  if ((scriptContext_local == (ScriptContext *)0x0) ||
     (SVar2 = Scope::GetScopeType((Scope *)scriptContext_local), SVar2 == ScopeType_Global)) {
    byteCodeGenerator_local = (ByteCodeGenerator *)0x0;
  }
  else {
    byteCodeGenerator_local = (ByteCodeGenerator *)Scope::GetScopeInfo((Scope *)scriptContext_local)
    ;
    if (byteCodeGenerator_local == (ByteCodeGenerator *)0x0) {
      byteCodeGenerator_local =
           (ByteCodeGenerator *)
           SaveOneScopeInfo(byteCodeGenerator,(Scope *)scriptContext_local,scriptContext);
      scope_00 = Scope::GetEnclosingScope((Scope *)scriptContext_local);
      if (scope_00 != (Scope *)0x0) {
        parent = SaveScopeInfo(byteCodeGenerator,scope_00,scriptContext);
        SetParentScopeInfo((ScopeInfo *)byteCodeGenerator_local,parent);
      }
    }
  }
  return (ScopeInfo *)byteCodeGenerator_local;
}

Assistant:

ScopeInfo * ScopeInfo::SaveScopeInfo(ByteCodeGenerator* byteCodeGenerator, Scope * scope, ScriptContext * scriptContext)
    {
        // Advance past scopes that will be excluded from the closure environment. (But note that we always want the body scope.)
        while (scope)
        {
            FuncInfo* func = scope->GetFunc();

            if (scope->GetMustInstantiate() ||
                func->GetBodyScope() == scope ||
                (func->GetParamScope() == scope && func->IsBodyAndParamScopeMerged() && scope->GetHasNestedParamFunc()))
            {
                break;
            }

            scope = scope->GetEnclosingScope();
        }

        // If we've exhausted the scope chain, we're done.
        if (scope == nullptr || scope->GetScopeType() == ScopeType_Global)
        {
            return nullptr;
        }

        // If we've already collected info for this scope, we're done.
        ScopeInfo * scopeInfo = scope->GetScopeInfo();
        if (scopeInfo != nullptr)
        {
            return scopeInfo;
        }

        // Do the work for this scope.
        scopeInfo = ScopeInfo::SaveOneScopeInfo(byteCodeGenerator, scope, scriptContext);

        // Link to the parent (if any).
        scope = scope->GetEnclosingScope();
        if (scope)
        {
            scopeInfo->SetParentScopeInfo(ScopeInfo::SaveScopeInfo(byteCodeGenerator, scope, scriptContext));
        }

        return scopeInfo;
    }